

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O3

Trivia __thiscall
slang::parsing::Preprocessor::parseBranchDirective
          (Preprocessor *this,Token directive,ConditionalDirectiveExpressionSyntax *expr,bool taken)

{
  SmallVector<slang::parsing::Token,_2UL> *this_00;
  BumpAllocator *this_01;
  Token TVar1;
  SyntaxKind SVar2;
  int iVar3;
  undefined4 extraout_var;
  ConditionalBranchDirectiveSyntax *syntax;
  undefined4 extraout_var_00;
  EVP_PKEY_CTX *src;
  Info *extraout_RDX;
  EVP_PKEY_CTX *src_00;
  Info *extraout_RDX_00;
  undefined7 in_register_00000081;
  Token token;
  SyntaxKind local_64;
  Token local_60;
  Token local_50;
  Trivia local_40;
  
  local_50.info = directive.info;
  local_50._0_8_ = directive._0_8_;
  this_00 = &this->scratchTokenBuffer;
  (this->scratchTokenBuffer).super_SmallVectorBase<slang::parsing::Token>.len = 0;
  if ((int)CONCAT71(in_register_00000081,taken) == 0) {
    do {
      local_60 = nextRaw(this);
      if (local_60.kind == Directive) {
        SVar2 = Token::directiveKind(&local_60);
        if (((SVar2 - ElseDirective < 0x40) &&
            ((0xa000000000000801U >> ((ulong)(SVar2 - ElseDirective) & 0x3f) & 1) != 0)) ||
           (SVar2 == ElsIfDirective)) goto LAB_002062ee;
      }
      else if (local_60.kind == EndOfFile) goto LAB_002062ee;
      SmallVectorBase<slang::parsing::Token>::emplace_back<slang::parsing::Token_const&>
                (&this_00->super_SmallVectorBase<slang::parsing::Token>,&local_60);
    } while( true );
  }
LAB_002062fb:
  this_01 = this->alloc;
  if (expr == (ConditionalDirectiveExpressionSyntax *)0x0) {
    local_64 = Token::directiveKind(&local_50);
    iVar3 = SmallVectorBase<slang::parsing::Token>::copy
                      (&this_00->super_SmallVectorBase<slang::parsing::Token>,
                       (EVP_PKEY_CTX *)this->alloc,src_00);
    local_60.rawLen = extraout_var_00;
    local_60.kind = (short)iVar3;
    local_60._2_1_ = (char)((uint)iVar3 >> 0x10);
    local_60.numFlags.raw = (char)((uint)iVar3 >> 0x18);
    local_60.info = extraout_RDX_00;
    syntax = (ConditionalBranchDirectiveSyntax *)
             BumpAllocator::
             emplace<slang::syntax::UnconditionalBranchDirectiveSyntax,slang::syntax::SyntaxKind,slang::parsing::Token&,std::span<slang::parsing::Token,18446744073709551615ul>>
                       (this_01,&local_64,&local_50,
                        (span<slang::parsing::Token,_18446744073709551615UL> *)&local_60);
  }
  else {
    local_64 = Token::directiveKind(&local_50);
    iVar3 = SmallVectorBase<slang::parsing::Token>::copy
                      (&this_00->super_SmallVectorBase<slang::parsing::Token>,
                       (EVP_PKEY_CTX *)this->alloc,src);
    local_60.rawLen = extraout_var;
    local_60.kind = (short)iVar3;
    local_60._2_1_ = (char)((uint)iVar3 >> 0x10);
    local_60.numFlags.raw = (char)((uint)iVar3 >> 0x18);
    local_60.info = extraout_RDX;
    syntax = BumpAllocator::
             emplace<slang::syntax::ConditionalBranchDirectiveSyntax,slang::syntax::SyntaxKind,slang::parsing::Token&,slang::syntax::ConditionalDirectiveExpressionSyntax&,std::span<slang::parsing::Token,18446744073709551615ul>>
                       (this_01,&local_64,&local_50,expr,
                        (span<slang::parsing::Token,_18446744073709551615UL> *)&local_60);
  }
  Trivia::Trivia(&local_40,Directive,(SyntaxNode *)syntax);
  return local_40;
LAB_002062ee:
  TVar1 = local_60;
  (this->currentToken).kind = local_60.kind;
  (this->currentToken).field_0x2 = local_60._2_1_;
  (this->currentToken).numFlags = (NumericTokenFlags)local_60.numFlags.raw;
  (this->currentToken).rawLen = local_60.rawLen;
  (this->currentToken).info = local_60.info;
  local_60 = TVar1;
  goto LAB_002062fb;
}

Assistant:

Trivia Preprocessor::parseBranchDirective(Token directive,
                                          syntax::ConditionalDirectiveExpressionSyntax* expr,
                                          bool taken) {
    scratchTokenBuffer.clear();
    if (!taken) {
        // skip over everything until we find another conditional compilation directive
        while (true) {
            auto token = nextRaw();

            // EoF or conditional directive stops the skipping process
            bool done = false;
            if (token.kind == TokenKind::EndOfFile) {
                done = true;
            }
            else if (token.kind == TokenKind::Directive) {
                switch (token.directiveKind()) {
                    case SyntaxKind::IfDefDirective:
                    case SyntaxKind::IfNDefDirective:
                    case SyntaxKind::ElsIfDirective:
                    case SyntaxKind::ElseDirective:
                    case SyntaxKind::EndIfDirective:
                        done = true;
                        break;
                    default:
                        break;
                }
            }

            if (done) {
                // put the token back so that we'll look at it next
                currentToken = token;
                break;
            }
            scratchTokenBuffer.push_back(token);
        }
    }

    SyntaxNode* syntax;
    if (expr) {
        syntax = alloc.emplace<ConditionalBranchDirectiveSyntax>(directive.directiveKind(),
                                                                 directive, *expr,
                                                                 scratchTokenBuffer.copy(alloc));
    }
    else {
        syntax = alloc.emplace<UnconditionalBranchDirectiveSyntax>(directive.directiveKind(),
                                                                   directive,
                                                                   scratchTokenBuffer.copy(alloc));
    }
    return Trivia(TriviaKind::Directive, syntax);
}